

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

void __thiscall CPU::CPX_AB(CPU *this)

{
  byte bVar1;
  uint16_t address;
  byte bVar2;
  uint8_t res;
  uint8_t op;
  CPU *this_local;
  
  this->cycles = 4;
  address = GetWord(this);
  bVar1 = ReadByte(this,address);
  bVar2 = this->X - bVar1;
  (this->field_6).ps = (this->field_6).ps & 0xfe | bVar1 <= this->X;
  (this->field_6).ps = (this->field_6).ps & 0xfd | (this->X == bVar1) << 1;
  (this->field_6).ps =
       (this->field_6).ps & 0x7f | ((bVar2 & 0x80) != 0 && -1 < (int)(bVar2 & 0x80)) << 7;
  return;
}

Assistant:

void CPU::CPX_AB()
{
    cycles = 4;
    uint8_t op = ReadByte(GetWord());
    uint8_t res = X - op;
    C = (X >= op);
    Z = (X == op);
    N = (res & 0b10000000) > 0;
}